

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_64x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int8_t cos_bit;
  int8_t *piVar19;
  int32_t *piVar20;
  int iVar21;
  ulong *puVar22;
  uint uVar23;
  int32_t *piVar24;
  ulong *puVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  undefined1 *puVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i in [256];
  int aiStack_1128 [56];
  int8_t local_1045;
  undefined4 local_1044;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined4 auStack_1030 [46];
  undefined1 local_f78 [3912];
  
  local_1044 = 0xd;
  bVar31 = tx_type < 0x10;
  uVar23 = 0xbeaf >> (tx_type & 0x1f);
  local_1045 = '\f';
  uVar26 = 0x7f1f >> (tx_type & 0x1f);
  puVar30 = local_f78;
  local_1040 = av1_fwd_txfm_shift_ls[0x12];
  iVar21 = (int)*av1_fwd_txfm_shift_ls[0x12];
  lVar29 = 0xf0;
  lVar28 = 0;
  puVar25 = (ulong *)input;
  do {
    lVar27 = lVar28 * stride;
    if ((uVar23 & 1) == 0 && bVar31) {
      uVar2 = puVar25[3];
      uVar3 = puVar25[2];
      uVar4 = puVar25[1];
      puVar22 = puVar25;
    }
    else {
      uVar2 = *puVar25;
      uVar3 = puVar25[1];
      uVar4 = puVar25[2];
      puVar22 = (ulong *)(input + lVar27 + 0xc);
    }
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar4;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar3;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar2;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = *puVar22;
    if ((uVar26 & 1) == 0 && bVar31) {
      auVar32 = pshuflw(auVar32,auVar32,0x1b);
      auVar36 = pshuflw(auVar36,auVar36,0x1b);
      auVar40 = pshuflw(auVar40,auVar40,0x1b);
      auVar44 = pshuflw(auVar44,auVar44,0x1b);
    }
    auVar32 = pmovsxwd(auVar32,auVar32);
    auVar36 = pmovsxwd(auVar36,auVar36);
    auVar40 = pmovsxwd(auVar40,auVar40);
    auVar44 = pmovsxwd(auVar44,auVar44);
    *(int *)((long)aiStack_1128 + lVar29) = auVar32._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 4) = auVar32._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 8) = auVar32._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xc) = auVar32._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x10) = auVar36._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x14) = auVar36._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x18) = auVar36._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x1c) = auVar36._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x20) = auVar40._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x24) = auVar40._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x28) = auVar40._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x2c) = auVar40._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x30) = auVar44._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x34) = auVar44._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x38) = auVar44._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x3c) = auVar44._12_4_;
    if ((uVar23 & 1) == 0 && bVar31) {
      puVar22 = puVar25 + 4;
      uVar2 = puVar25[7];
      uVar3 = puVar25[6];
      uVar4 = puVar25[5];
    }
    else {
      uVar2 = puVar25[4];
      uVar3 = puVar25[5];
      uVar4 = puVar25[6];
      puVar22 = (ulong *)(input + lVar27 + 0x1c);
    }
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar4;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar3;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar2;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *puVar22;
    if ((uVar26 & 1) == 0 && bVar31) {
      auVar33 = pshuflw(auVar33,auVar33,0x1b);
      auVar37 = pshuflw(auVar37,auVar37,0x1b);
      auVar41 = pshuflw(auVar41,auVar41,0x1b);
      auVar45 = pshuflw(auVar45,auVar45,0x1b);
    }
    auVar32 = pmovsxwd(auVar33,auVar33);
    auVar36 = pmovsxwd(auVar37,auVar37);
    auVar40 = pmovsxwd(auVar41,auVar41);
    auVar44 = pmovsxwd(auVar45,auVar45);
    *(int *)((long)aiStack_1128 + lVar29 + 0x40) = auVar32._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x44) = auVar32._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x48) = auVar32._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x4c) = auVar32._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x50) = auVar36._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x54) = auVar36._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x58) = auVar36._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x5c) = auVar36._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x60) = auVar40._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 100) = auVar40._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x68) = auVar40._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x6c) = auVar40._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x70) = auVar44._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x74) = auVar44._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x78) = auVar44._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x7c) = auVar44._12_4_;
    if ((uVar23 & 1) == 0 && bVar31) {
      puVar22 = puVar25 + 8;
      uVar2 = puVar25[0xb];
      uVar3 = puVar25[10];
      uVar4 = puVar25[9];
    }
    else {
      uVar2 = puVar25[8];
      uVar3 = puVar25[9];
      uVar4 = puVar25[10];
      puVar22 = (ulong *)(input + lVar27 + 0x2c);
    }
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar4;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar3;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar2;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *puVar22;
    if ((uVar26 & 1) == 0 && bVar31) {
      auVar34 = pshuflw(auVar34,auVar34,0x1b);
      auVar38 = pshuflw(auVar38,auVar38,0x1b);
      auVar42 = pshuflw(auVar42,auVar42,0x1b);
      auVar46 = pshuflw(auVar46,auVar46,0x1b);
    }
    auVar32 = pmovsxwd(auVar34,auVar34);
    auVar36 = pmovsxwd(auVar38,auVar38);
    auVar40 = pmovsxwd(auVar42,auVar42);
    auVar44 = pmovsxwd(auVar46,auVar46);
    *(int *)((long)aiStack_1128 + lVar29 + 0x80) = auVar32._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x84) = auVar32._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x88) = auVar32._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x8c) = auVar32._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x90) = auVar36._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0x94) = auVar36._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x98) = auVar36._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0x9c) = auVar36._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xa0) = auVar40._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0xa4) = auVar40._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xa8) = auVar40._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xac) = auVar40._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xb0) = auVar44._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0xb4) = auVar44._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xb8) = auVar44._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xbc) = auVar44._12_4_;
    if ((uVar23 & 1) == 0 && bVar31) {
      puVar22 = puVar25 + 0xc;
      uVar2 = puVar25[0xf];
      uVar3 = puVar25[0xe];
      uVar4 = puVar25[0xd];
    }
    else {
      uVar2 = puVar25[0xc];
      uVar3 = puVar25[0xd];
      uVar4 = puVar25[0xe];
      puVar22 = (ulong *)(input + lVar27 + 0x3c);
    }
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar4;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *puVar22;
    if ((uVar26 & 1) == 0 && bVar31) {
      auVar35 = pshuflw(auVar35,auVar35,0x1b);
      auVar39 = pshuflw(auVar39,auVar39,0x1b);
      auVar43 = pshuflw(auVar43,auVar43,0x1b);
      auVar47 = pshuflw(auVar47,auVar47,0x1b);
    }
    auVar32 = pmovsxwd(auVar35,auVar35);
    auVar36 = pmovsxwd(auVar39,auVar39);
    auVar40 = pmovsxwd(auVar43,auVar43);
    auVar44 = pmovsxwd(auVar47,auVar47);
    *(int *)((long)aiStack_1128 + lVar29 + 0xc0) = auVar32._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0xc4) = auVar32._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 200) = auVar32._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xcc) = auVar32._12_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xd0) = auVar36._0_4_ << iVar21;
    *(int *)((long)aiStack_1128 + lVar29 + 0xd4) = auVar36._4_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xd8) = auVar36._8_4_;
    *(int *)((long)aiStack_1128 + lVar29 + 0xdc) = auVar36._12_4_;
    *(int *)(&stack0xffffffffffffefb8 + lVar29) = auVar40._0_4_ << iVar21;
    *(int *)((long)&local_1044 + lVar29) = auVar40._4_4_;
    *(int *)((long)&local_1040 + lVar29) = auVar40._8_4_;
    *(int *)((long)&local_1040 + lVar29 + 4) = auVar40._12_4_;
    *(int *)((long)&local_1038 + lVar29) = auVar44._0_4_ << iVar21;
    *(int *)((long)auStack_1030 + lVar29 + -4) = auVar44._4_4_;
    *(int *)((long)auStack_1030 + lVar29) = auVar44._8_4_;
    *(int *)((long)auStack_1030 + lVar29 + 4) = auVar44._12_4_;
    lVar28 = lVar28 + 1;
    puVar25 = (ulong *)((long)puVar25 + (long)stride * 2);
    lVar29 = lVar29 + 0x100;
  } while (lVar29 != 0x10f0);
  aiStack_1128[0x36] = 0x42563c;
  aiStack_1128[0x37] = 0;
  fdct16x16_sse4_1((__m128i *)&local_1038,(__m128i *)coeff,0xd,0x10);
  piVar19 = local_1040;
  aiStack_1128[0x36] = 0x425651;
  aiStack_1128[0x37] = 0;
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)local_1040[1]);
  aiStack_1128[0x36] = 0x425665;
  aiStack_1128[0x37] = 0;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar19[1]);
  aiStack_1128[0x36] = 0x42567c;
  aiStack_1128[0x37] = 0;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar19[1]);
  aiStack_1128[0x36] = 0x425690;
  aiStack_1128[0x37] = 0;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar19[1]);
  cos_bit = local_1045;
  piVar20 = coeff + 0xc0;
  lVar28 = 0;
  do {
    lVar29 = -0x40;
    piVar24 = piVar20;
    do {
      iVar12 = piVar24[-0xbf];
      iVar13 = piVar24[-0xbe];
      iVar14 = piVar24[-0xbd];
      iVar5 = piVar24[-0x7f];
      iVar6 = piVar24[-0x7e];
      iVar7 = piVar24[-0x7d];
      iVar15 = piVar24[-0x40];
      iVar16 = piVar24[-0x3f];
      iVar17 = piVar24[-0x3e];
      iVar18 = piVar24[-0x3d];
      iVar8 = *piVar24;
      iVar9 = piVar24[1];
      iVar10 = piVar24[2];
      iVar11 = piVar24[3];
      *(ulong *)(puVar30 + lVar29 + -0x80) = CONCAT44(piVar24[-0x80],piVar24[-0xc0]);
      *(ulong *)((long)(puVar30 + lVar29 + -0x80) + 8) = CONCAT44(iVar8,iVar15);
      *(int32_t *)(puVar30 + lVar29 + -0x38) = iVar12;
      *(int32_t *)(puVar30 + lVar29 + -0x34) = iVar5;
      *(int32_t *)(puVar30 + lVar29 + -0x30) = iVar16;
      *(int32_t *)(puVar30 + lVar29 + -0x2c) = iVar9;
      piVar1 = (int32_t *)(puVar30 + lVar29);
      *piVar1 = iVar13;
      piVar1[1] = iVar6;
      piVar1[2] = iVar17;
      piVar1[3] = iVar10;
      *(int32_t *)(puVar30 + lVar29 + 0x48) = iVar14;
      *(int32_t *)(puVar30 + lVar29 + 0x4c) = iVar7;
      *(int32_t *)(puVar30 + lVar29 + 0x50) = iVar18;
      *(int32_t *)(puVar30 + lVar29 + 0x54) = iVar11;
      piVar24 = piVar24 + 0x100;
      lVar29 = lVar29 + 0x10;
    } while (lVar29 != 0);
    lVar28 = lVar28 + 1;
    piVar20 = piVar20 + 4;
    puVar30 = puVar30 + 0x100;
  } while (lVar28 != 0x10);
  lVar28 = 0;
  do {
    aiStack_1128[0x36] = 0x425755;
    aiStack_1128[0x37] = 0;
    av1_fdct64_sse4_1((__m128i *)((long)&local_1038 + lVar28),(__m128i *)((long)coeff + lVar28),
                      cos_bit,4,4);
    lVar28 = lVar28 + 0x10;
  } while (lVar28 != 0x40);
  aiStack_1128[0x36] = 0x42576e;
  aiStack_1128[0x37] = 0;
  memset((__m128i *)(coeff + 0x200),0,0x800);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X16];
  const int txw_idx = get_txw_idx(TX_64X16);
  const int txh_idx = get_txh_idx(TX_64X16);
  const int txfm_size_col = tx_size_wide[TX_64X16];
  const int txfm_size_row = tx_size_high[TX_64X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  for (int i = 0; i < txfm_size_row; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
  }

  fdct16x16_sse4_1(in, outcoeff128, bitcol, txfm_size_row);
  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);
  for (int i = 0; i < 4; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitrow, 4, 4);
  }
  memset(coeff + txfm_size_row * 32, 0, txfm_size_row * 32 * sizeof(*coeff));
  (void)bd;
}